

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.h
# Opt level: O0

void RegisterAllCoreRPCCommands(CRPCTable *t)

{
  long lVar1;
  long in_FS_OFFSET;
  CRPCTable *in_stack_00000040;
  CRPCTable *in_stack_00000050;
  CRPCTable *in_stack_00000070;
  CRPCTable *in_stack_00000088;
  CRPCTable *in_stack_000000a8;
  CRPCTable *in_stack_000000c0;
  CRPCTable *in_stack_00000118;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RegisterBlockchainRPCCommands(in_stack_00000118);
  RegisterFeeRPCCommands(in_stack_00000040);
  RegisterMempoolRPCCommands(in_stack_00000088);
  RegisterMiningRPCCommands(in_stack_00000088);
  RegisterNodeRPCCommands(in_stack_00000070);
  RegisterNetRPCCommands(in_stack_000000c0);
  RegisterOutputScriptRPCCommands(in_stack_00000050);
  RegisterRawTransactionRPCCommands(in_stack_000000a8);
  RegisterSignMessageRPCCommands(in_stack_00000040);
  RegisterSignerRPCCommands(in_stack_00000040);
  RegisterTxoutProofRPCCommands(in_stack_00000040);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void RegisterAllCoreRPCCommands(CRPCTable &t)
{
    RegisterBlockchainRPCCommands(t);
    RegisterFeeRPCCommands(t);
    RegisterMempoolRPCCommands(t);
    RegisterMiningRPCCommands(t);
    RegisterNodeRPCCommands(t);
    RegisterNetRPCCommands(t);
    RegisterOutputScriptRPCCommands(t);
    RegisterRawTransactionRPCCommands(t);
    RegisterSignMessageRPCCommands(t);
#ifdef ENABLE_EXTERNAL_SIGNER
    RegisterSignerRPCCommands(t);
#endif // ENABLE_EXTERNAL_SIGNER
    RegisterTxoutProofRPCCommands(t);
}